

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

void linenoise::disableRawMode(int fd)

{
  int iVar1;
  int fd_local;
  
  if ((rawmode & 1) != 0) {
    iVar1 = tcsetattr(fd,2,(termios *)orig_termios);
    if (iVar1 != -1) {
      rawmode = 0;
    }
  }
  return;
}

Assistant:

inline void disableRawMode(int fd) {
#ifdef _WIN32
    if (consolemodeIn) {
      SetConsoleMode(hIn, consolemodeIn);
      consolemodeIn = 0;
    }
    rawmode = false;
#else
    /* Don't even check the return value as it's too late. */
    if (rawmode && tcsetattr(fd,TCSAFLUSH,&orig_termios) != -1)
        rawmode = false;
#endif
}